

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cd03::TestXmlTestReporterFixtureOneFailureAndOneSuccess::RunImpl
          (TestXmlTestReporterFixtureOneFailureAndOneSuccess *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_1c0 [8];
  XmlTestReporterFixtureOneFailureAndOneSuccessHelper fixtureHelper;
  bool ctorOk;
  TestXmlTestReporterFixtureOneFailureAndOneSuccess *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  XmlTestReporterFixtureOneFailureAndOneSuccessHelper::
  XmlTestReporterFixtureOneFailureAndOneSuccessHelper
            ((XmlTestReporterFixtureOneFailureAndOneSuccessHelper *)local_1c0,
             &(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::ExecuteTest<(anonymous_namespace)::XmlTestReporterFixtureOneFailureAndOneSuccessHelper>
            ((XmlTestReporterFixtureOneFailureAndOneSuccessHelper *)local_1c0,
             &(this->super_Test).m_details);
  XmlTestReporterFixtureOneFailureAndOneSuccessHelper::
  ~XmlTestReporterFixtureOneFailureAndOneSuccessHelper
            ((XmlTestReporterFixtureOneFailureAndOneSuccessHelper *)local_1c0);
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, OneFailureAndOneSuccess)
{
    TestDetails const failedDetails("FailedTest", "suite", "fail.h", 1);
    reporter.ReportTestStart(failedDetails);
    reporter.ReportFailure(failedDetails, "expected 1 but was 2");
    reporter.ReportTestFinish(failedDetails, 0.1f);

    TestDetails const succeededDetails("SucceededTest", "suite", "", 0);
    reporter.ReportTestStart(succeededDetails);
    reporter.ReportTestFinish(succeededDetails, 1.0f);
    reporter.ReportSummary(2, 1, 1, 1.1f);

    char const* expected =
        "<?xml version=\"1.0\"?>"
        "<unittest-results tests=\"2\" failedtests=\"1\" failures=\"1\" time=\"1.1\">"
        "<test suite=\"suite\" name=\"FailedTest\" time=\"0.1\">"
        "<failure message=\"fail.h(1) : expected 1 but was 2\"/>"
        "</test>"
        "<test suite=\"suite\" name=\"SucceededTest\" time=\"1\"/>"
        "</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}